

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall chaiscript::parser::ChaiScript_Parser::Class_Statements(ChaiScript_Parser *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar3 = false;
  do {
    do {
      do {
        bVar2 = bVar3;
        bVar1 = Def(this,true);
        bVar3 = true;
      } while (bVar1);
      bVar1 = Var_Decl(this,true);
    } while (bVar1);
    SkipWS(this,false);
    bVar1 = Eol_(this,false);
  } while (bVar1);
  return bVar2;
}

Assistant:

bool Class_Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true) || Var_Decl(true)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }